

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

void lodepng::convertToXYZ_gamma_table
               (float *out,size_t n,size_t c,LodePNGInfo *info,uint use_icc,LodePNGICC *icc)

{
  uint uVar1;
  size_t sVar2;
  float fVar3;
  float fVar4;
  
  fVar4 = 1.0 / (float)(long)(n - 1);
  if (use_icc == 0) {
    if ((info->gama_defined == 0) || (info->srgb_defined != 0)) {
      for (sVar2 = 0; n != sVar2; sVar2 = sVar2 + 1) {
        fVar3 = (float)(long)sVar2 * fVar4;
        if (0.04045 <= fVar3) {
          fVar3 = lodepng_powf((fVar3 + 0.055) / 1.055,2.4);
        }
        else {
          fVar3 = fVar3 / 12.92;
        }
        out[sVar2] = fVar3;
      }
    }
    else {
      uVar1 = info->gama_gamma;
      if (uVar1 == 100000) {
        for (sVar2 = 0; n != sVar2; sVar2 = sVar2 + 1) {
          out[sVar2] = (float)(long)sVar2 * fVar4;
        }
      }
      else {
        for (sVar2 = 0; n != sVar2; sVar2 = sVar2 + 1) {
          fVar3 = lodepng_powf((float)(long)sVar2 * fVar4,100000.0 / (float)uVar1);
          out[sVar2] = fVar3;
        }
      }
    }
  }
  else {
    for (sVar2 = 0; n != sVar2; sVar2 = sVar2 + 1) {
      fVar3 = iccForwardTRC(icc->trc + c,(float)(long)sVar2 * fVar4);
      out[sVar2] = fVar3;
    }
  }
  return;
}

Assistant:

static void convertToXYZ_gamma_table(float* out, size_t n, size_t c,
                                     const LodePNGInfo* info, unsigned use_icc, const LodePNGICC* icc) {
  size_t i;
  float mul = 1.0f / (n - 1);
  if(use_icc) {
    for(i = 0; i < n; i++) {
      float v = i * mul;
      out[i] = iccForwardTRC(&icc->trc[c], v);
    }
  } else if(info->gama_defined && !info->srgb_defined) {
    /* no power needed if gamma is 1 */
    if(info->gama_gamma == 100000) {
      for(i = 0; i < n; i++) {
        out[i] = i * mul;
      }
    } else {
      float gamma = 100000.0f / info->gama_gamma;
      for(i = 0; i < n; i++) {
        float v = i * mul;
        out[i] = lodepng_powf(v, gamma);
      }
    }
  } else {
    for(i = 0; i < n; i++) {
      /* sRGB gamma expand */
      float v = i * mul;
      out[i] = (v < 0.04045f) ? (v / 12.92f) : lodepng_powf((v + 0.055f) / 1.055f, 2.4f);
    }
  }
}